

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O0

TemplateDictionary * MakeDictionary(int i)

{
  TemplateDictionary *pTStack_10;
  int i_local;
  
  if (i == 1) {
    pTStack_10 = MakeDict1();
  }
  else if (i == 2) {
    pTStack_10 = MakeDict2();
  }
  else {
    if (i != 3) {
      printf("%s: %d: ASSERT FAILED: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
             ,0x17a,"false");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                    ,0x17a,"TemplateDictionary *MakeDictionary(int)");
    }
    pTStack_10 = MakeDict3();
  }
  return pTStack_10;
}

Assistant:

static TemplateDictionary* MakeDictionary(int i) {
  switch (i) {
    case 1: return MakeDict1();
    case 2: return MakeDict2();
    case 3: return MakeDict3();
    default: ASSERT(false);  // No dictionary with this number yet.
  }
  return NULL;
}